

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

BOOL __thiscall
Js::CustomExternalWrapperObject::VerifyObjectAlive(CustomExternalWrapperObject *this)

{
  ScriptContext *this_00;
  bool bVar1;
  BOOL BVar2;
  BOOL BVar3;
  
  this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  BVar3 = 0;
  BVar2 = ScriptContext::VerifyAlive(this_00,0,(ScriptContext *)0x0);
  if ((BVar2 != 0) && (BVar3 = 1, this_00->isInvalidatedForHostObjects == true)) {
    bVar1 = ThreadContext::RecordImplicitException(this_00->threadContext);
    BVar3 = 0;
    if (bVar1) {
      JavascriptError::MapAndThrowError(this_00,-0x7ff8fffb);
    }
  }
  return BVar3;
}

Assistant:

BOOL CustomExternalWrapperObject::VerifyObjectAlive()
{
    Js::ScriptContext* scriptContext = GetScriptContext();
    if (!scriptContext->VerifyAlive())
    {
        return FALSE;
    }

    // Perform an extended host object invalidation check only for external host objects.
    if (scriptContext->IsInvalidatedForHostObjects())
    {
        if (!scriptContext->GetThreadContext()->RecordImplicitException())
            return FALSE;
        Js::JavascriptError::MapAndThrowError(scriptContext, E_ACCESSDENIED);
    }
    return TRUE;
}